

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall Parser::parse<bool(&)(Character)>(Parser *this,_func_bool_Character *f)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  Character CVar4;
  StringView copy;
  _func_bool_Character *f_local;
  Parser *this_local;
  
  bVar3 = StringView::has_next(&this->s);
  if (bVar3) {
    pcVar1 = (this->s).s;
    sVar2 = (this->s).size;
    CVar4 = StringView::next(&this->s);
    bVar3 = (*f)((Character)CVar4.c);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      (this->s).s = pcVar1;
      (this->s).size = sVar2;
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parse(F&& f) {
		if (!s.has_next()) return false;
		StringView copy = s;
		if (!f(s.next())) {
			s = copy;
			return false;
		}
		return true;
	}